

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# environment_tests.cpp
# Opt level: O2

void __thiscall MyEnvironment2::TearDown(MyEnvironment2 *this)

{
  int *in_R9;
  AssertionResult iutest_ar;
  iuCodeMessage local_1c0;
  Fixed local_190;
  
  local_190.super_Message.m_stream.super_iu_stringstream._0_4_ = 2;
  iutest::internal::CmpHelperEQ<int,int>
            (&iutest_ar,(internal *)"2","test_counter",(char *)&local_190,&test_counter,in_R9);
  if (iutest_ar.m_result == false) {
    memset(&local_190,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_190);
    iutest::detail::iuCodeMessage::iuCodeMessage
              (&local_1c0,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/environment_tests.cpp"
               ,0x3e,iutest_ar.m_message._M_dataplus._M_p);
    local_1c0._44_4_ = 2;
    iutest::AssertionHelper::operator=((AssertionHelper *)&local_1c0,&local_190);
    std::__cxx11::string::~string((string *)&local_1c0);
    iutest::iu_global_format_stringstream::~iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_190);
    std::__cxx11::string::~string((string *)&iutest_ar);
  }
  else {
    std::__cxx11::string::~string((string *)&iutest_ar);
    test_counter = test_counter + -1;
  }
  return;
}

Assistant:

virtual void TearDown(void) IUTEST_CXX_OVERRIDE
    {
        IUTEST_ASSERT_EQ(2, test_counter);
        --test_counter;
    }